

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTextureCube::TestTextureCube
          (TestTextureCube *this,CompressedTexFormat *format,int size)

{
  int iVar1;
  PixelBufferAccess *__src;
  reference __dest;
  int local_5c;
  int local_58;
  int faceNdx;
  int levelNdx;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> levels;
  TextureFormat local_24;
  int local_1c;
  CompressedTexFormat *pCStack_18;
  int size_local;
  CompressedTexFormat *format_local;
  TestTextureCube *this_local;
  
  local_1c = size;
  pCStack_18 = format;
  format_local = (CompressedTexFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,size,size,1);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCube_016a4648;
  local_24 = tcu::getUncompressedFormat(*pCStack_18);
  tcu::TextureCube::TextureCube(&this->m_texture,&local_24,local_1c);
  iVar1 = tcu::TextureCube::getNumLevels(&this->m_texture);
  std::allocator<tcu::PixelBufferAccess>::allocator
            ((allocator<tcu::PixelBufferAccess> *)((long)&faceNdx + 3));
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&levelNdx,
             (long)(iVar1 * 6),(allocator<tcu::PixelBufferAccess> *)((long)&faceNdx + 3));
  std::allocator<tcu::PixelBufferAccess>::~allocator
            ((allocator<tcu::PixelBufferAccess> *)((long)&faceNdx + 3));
  local_58 = 0;
  while( true ) {
    iVar1 = (*(this->super_TestTexture)._vptr_TestTexture[2])();
    if (iVar1 <= local_58) break;
    for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
      tcu::TextureCube::allocLevel
                (&this->m_texture,*(CubeFace *)(tcuFaceMapping + (long)local_5c * 4),local_58);
      __src = tcu::TextureCube::getLevelFace
                        (&this->m_texture,local_58,
                         *(CubeFace *)(tcuFaceMapping + (long)local_5c * 4));
      __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
               operator[]((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *
                          )&levelNdx,(long)(local_58 * 6 + local_5c));
      memcpy(__dest,__src,0x28);
    }
    local_58 = local_58 + 1;
  }
  TestTexture::populateCompressedLevels
            (&this->super_TestTexture,*pCStack_18,
             (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&levelNdx);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&levelNdx);
  return;
}

Assistant:

TestTextureCube::TestTextureCube (const tcu::CompressedTexFormat& format, int size)
	: TestTexture	(format, size, size, 1)
	, m_texture		(tcu::getUncompressedFormat(format), size)
{
	std::vector<tcu::PixelBufferAccess> levels(m_texture.getNumLevels() * tcu::CUBEFACE_LAST);

	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			m_texture.allocLevel(tcuFaceMapping[faceNdx], levelNdx);
			levels[levelNdx * tcu::CUBEFACE_LAST + faceNdx] = m_texture.getLevelFace(levelNdx, tcuFaceMapping[faceNdx]);
		}
	}

	TestTexture::populateCompressedLevels(format, levels);
}